

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::DescriptorBuilder::ValidateServiceOptions
          (DescriptorBuilder *this,ServiceDescriptor *service,ServiceDescriptorProto *proto)

{
  long lVar1;
  FileOptions *pFVar2;
  FileOptions *pFVar3;
  int index;
  
  lVar1 = *(long *)(service + 0x10);
  if (lVar1 != 0) {
    pFVar2 = *(FileOptions **)(lVar1 + 0xa0);
    pFVar3 = FileOptions::default_instance();
    if (((pFVar2 != pFVar3) && (*(int *)(*(long *)(lVar1 + 0xa0) + 0xa8) == 3)) &&
       ((*(char *)(*(long *)(*(long *)(service + 0x10) + 0xa0) + 0xa3) != '\0' ||
        (*(char *)(*(long *)(*(long *)(service + 0x10) + 0xa0) + 0xa4) == '\x01')))) {
      AddError(this,*(string **)(service + 8),&proto->super_Message,NAME,
               "Files with optimize_for = LITE_RUNTIME cannot define services unless you set both options cc_generic_services and java_generic_sevices to false."
              );
    }
  }
  if (0 < *(int *)(service + 0x20)) {
    index = 0;
    do {
      internal::RepeatedPtrFieldBase::
      Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                (&(proto->method_).super_RepeatedPtrFieldBase,index);
      index = index + 1;
    } while (index < *(int *)(service + 0x20));
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateServiceOptions(ServiceDescriptor* service,
    const ServiceDescriptorProto& proto) {
  if (IsLite(service->file()) &&
      (service->file()->options().cc_generic_services() ||
       service->file()->options().java_generic_services())) {
    AddError(service->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Files with optimize_for = LITE_RUNTIME cannot define services "
             "unless you set both options cc_generic_services and "
             "java_generic_sevices to false.");
  }

  VALIDATE_OPTIONS_FROM_ARRAY(service, method, Method);
}